

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFont.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIFont::CGUIFont(CGUIFont *this,IGUIEnvironment *env,path *filename)

{
  undefined8 uVar1;
  pointer pSVar2;
  void **in_RDX;
  pointer in_RSI;
  array<irr::gui::CGUIFont::SFontArea> *in_RDI;
  
  IReferenceCounted::IReferenceCounted((IReferenceCounted *)(in_RDI + 5));
  IGUIFontBitmap::IGUIFontBitmap((IGUIFontBitmap *)in_RSI,in_RDX);
  (in_RDI->m_data).
  super__Vector_base<irr::gui::CGUIFont::SFontArea,_std::allocator<irr::gui::CGUIFont::SFontArea>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x446938;
  in_RDI[5].m_data.
  super__Vector_base<irr::gui::CGUIFont::SFontArea,_std::allocator<irr::gui::CGUIFont::SFontArea>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x4469b8;
  core::array<irr::gui::CGUIFont::SFontArea>::array(in_RDI);
  ::std::map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>::map
            ((map<wchar_t,_int,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
              *)0x3b8ccc);
  *(undefined8 *)&in_RDI[2].is_sorted = 0;
  in_RDI[3].m_data.
  super__Vector_base<irr::gui::CGUIFont::SFontArea,_std::allocator<irr::gui::CGUIFont::SFontArea>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  in_RDI[3].m_data.
  super__Vector_base<irr::gui::CGUIFont::SFontArea,_std::allocator<irr::gui::CGUIFont::SFontArea>_>.
  _M_impl.super__Vector_impl_data._M_finish = in_RSI;
  *(undefined4 *)
   &in_RDI[3].m_data.
    super__Vector_base<irr::gui::CGUIFont::SFontArea,_std::allocator<irr::gui::CGUIFont::SFontArea>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = 0;
  *(undefined4 *)
   ((long)&in_RDI[3].m_data.
           super__Vector_base<irr::gui::CGUIFont::SFontArea,_std::allocator<irr::gui::CGUIFont::SFontArea>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined4 *)&in_RDI[3].is_sorted = 0;
  *(undefined4 *)&in_RDI[3].field_0x1c = 0;
  core::string<wchar_t>::string((string<wchar_t> *)0x3b8d12);
  if (in_RDI[3].m_data.
      super__Vector_base<irr::gui::CGUIFont::SFontArea,_std::allocator<irr::gui::CGUIFont::SFontArea>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    uVar1 = (**(code **)(*(long *)in_RDI[3].m_data.
                                  super__Vector_base<irr::gui::CGUIFont::SFontArea,_std::allocator<irr::gui::CGUIFont::SFontArea>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + 0x30))();
    *(undefined8 *)&in_RDI[2].is_sorted = uVar1;
    pSVar2 = in_RDI[3].m_data.
             super__Vector_base<irr::gui::CGUIFont::SFontArea,_std::allocator<irr::gui::CGUIFont::SFontArea>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pSVar2 = (pointer)(**(code **)(*(long *)pSVar2 + 0xa0))(pSVar2,in_RDX);
    in_RDI[3].m_data.
    super__Vector_base<irr::gui::CGUIFont::SFontArea,_std::allocator<irr::gui::CGUIFont::SFontArea>_>
    ._M_impl.super__Vector_impl_data._M_start = pSVar2;
    if (in_RDI[3].m_data.
        super__Vector_base<irr::gui::CGUIFont::SFontArea,_std::allocator<irr::gui::CGUIFont::SFontArea>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      pSVar2 = in_RDI[3].m_data.
               super__Vector_base<irr::gui::CGUIFont::SFontArea,_std::allocator<irr::gui::CGUIFont::SFontArea>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pSVar2 = (pointer)(**(code **)(*(long *)pSVar2 + 0xa8))(pSVar2,in_RDX);
      in_RDI[3].m_data.
      super__Vector_base<irr::gui::CGUIFont::SFontArea,_std::allocator<irr::gui::CGUIFont::SFontArea>_>
      ._M_impl.super__Vector_impl_data._M_start = pSVar2;
    }
    if (in_RDI[3].m_data.
        super__Vector_base<irr::gui::CGUIFont::SFontArea,_std::allocator<irr::gui::CGUIFont::SFontArea>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      pSVar2 = in_RDI[3].m_data.
               super__Vector_base<irr::gui::CGUIFont::SFontArea,_std::allocator<irr::gui::CGUIFont::SFontArea>_>
               ._M_impl.super__Vector_impl_data._M_start;
      IReferenceCounted::grab
                ((IReferenceCounted *)
                 ((long)&pSVar2->underhang + *(long *)(*(long *)pSVar2 + -0x18)));
    }
  }
  if (*(long *)&in_RDI[2].is_sorted != 0) {
    IReferenceCounted::grab
              ((IReferenceCounted *)
               ((long)*(long **)&in_RDI[2].is_sorted +
               *(long *)(**(long **)&in_RDI[2].is_sorted + -0x18)));
  }
  (**(code **)((in_RDI->m_data).
               super__Vector_base<irr::gui::CGUIFont::SFontArea,_std::allocator<irr::gui::CGUIFont::SFontArea>_>
               ._M_impl.super__Vector_impl_data._M_start + 4))(in_RDI,L" ");
  return;
}

Assistant:

CGUIFont::CGUIFont(IGUIEnvironment *env, const io::path &filename) :
		Driver(0), SpriteBank(0), Environment(env), WrongCharacter(0),
		MaxHeight(0), GlobalKerningWidth(0), GlobalKerningHeight(0)
{
#ifdef _DEBUG
	setDebugName("CGUIFont");
#endif

	if (Environment) {
		// don't grab environment, to avoid circular references
		Driver = Environment->getVideoDriver();

		SpriteBank = Environment->getSpriteBank(filename);
		if (!SpriteBank) // could be default-font which has no file
			SpriteBank = Environment->addEmptySpriteBank(filename);
		if (SpriteBank)
			SpriteBank->grab();
	}

	if (Driver)
		Driver->grab();

	setInvisibleCharacters(L" ");
}